

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVectorImpl<$3d6ce247$>::~SmallVectorImpl(SmallVectorImpl<_3d6ce247_> *this)

{
  undefined1 *__ptr;
  
  SmallVectorTemplateBase<$1fc6c516$>::destroy_range
            ((InstanceGroupRef<_b8373603_> *)
             (this->super_SmallVectorTemplateBase<_1fc6c516_>).
             super_SmallVectorTemplateCommon<_7cecdb41_>.super_SmallVectorBase.BeginX,
             (InstanceGroupRef<_b8373603_> *)
             (this->super_SmallVectorTemplateBase<_1fc6c516_>).
             super_SmallVectorTemplateCommon<_7cecdb41_>.super_SmallVectorBase.EndX);
  __ptr = (undefined1 *)
          (this->super_SmallVectorTemplateBase<_1fc6c516_>).
          super_SmallVectorTemplateCommon<_7cecdb41_>.super_SmallVectorBase.BeginX;
  if ((U *)__ptr !=
      &(this->super_SmallVectorTemplateBase<_1fc6c516_>).super_SmallVectorTemplateCommon<_7cecdb41_>
       .FirstEl) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

~SmallVectorImpl() {
    // Destroy the constructed elements in the vector.
    this->destroy_range(this->begin(), this->end());

    // If this wasn't grown from the inline copy, deallocate the old space.
    if (!this->isSmall())
      free(this->begin());
  }